

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O2

void __thiscall
duckdb::DatabaseManager::ResetDatabases
          (DatabaseManager *this,
          unique_ptr<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>,_true>
          *scheduler)

{
  pointer prVar1;
  pointer this_00;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *__range1;
  reference_wrapper<duckdb::AttachedDatabase> *database;
  pointer prVar2;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> result;
  _Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  local_58;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->databases);
  local_40._8_8_ = 0;
  local_28 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/database_manager.cpp:227:18)>
             ::_M_invoke;
  local_30 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/main/database_manager.cpp:227:18)>
             ::_M_manager;
  local_40._M_unused._M_object = &local_58;
  CatalogSet::Scan(this_00,(function<void_(duckdb::CatalogEntry_&)> *)&local_40);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  prVar1 = local_58._M_impl.super__Vector_impl_data._M_finish;
  for (prVar2 = local_58._M_impl.super__Vector_impl_data._M_start; prVar2 != prVar1;
      prVar2 = prVar2 + 1) {
    AttachedDatabase::Close(prVar2->_M_data);
  }
  ::std::__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_>::reset
            ((__uniq_ptr_impl<duckdb::TaskScheduler,_std::default_delete<duckdb::TaskScheduler>_> *)
             scheduler,(pointer)0x0);
  ::std::__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::reset
            ((__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)
             &this->databases,(pointer)0x0);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ::~_Vector_base(&local_58);
  return;
}

Assistant:

void DatabaseManager::ResetDatabases(unique_ptr<TaskScheduler> &scheduler) {
	vector<reference<AttachedDatabase>> result;
	databases->Scan([&](CatalogEntry &entry) { result.push_back(entry.Cast<AttachedDatabase>()); });
	for (auto &database : result) {
		database.get().Close();
	}
	scheduler.reset();
	databases.reset();
}